

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,size_t depender_index,cmLinkItem *dependee_name,bool linking
          ,bool cross)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  string *psVar5;
  PolicyID id;
  cmGeneratorTarget *this_01;
  ostringstream e;
  MessageType local_1e0;
  string local_1d8;
  size_t local_1b8;
  cmake *local_1b0;
  undefined1 local_1a8 [376];
  
  this_01 = dependee_name->Target;
  local_1b8 = depender_index;
  if (this_01 == (cmGeneratorTarget *)0x0 && !linking) {
    this_00 = (this->Targets).
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_start[depender_index];
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (TVar2 != GLOBAL_TARGET) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      PVar3 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0046);
      if (PVar3 - NEW < 3) {
        bVar1 = true;
        local_1e0 = FATAL_ERROR;
      }
      else {
        local_1e0 = AUTHOR_WARNING;
        if (PVar3 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)0x2e,id);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,
                              local_1d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      if (bVar1) {
        local_1b0 = this->GlobalGenerator->CMakeInstance;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The dependency target \"",0x17);
        poVar4 = operator<<((ostream *)local_1a8,dependee_name);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" of target \"",0xd);
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" does not exist.",0x11);
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(local_1b0,local_1e0,&local_1d8,&dependee_name->Backtrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
  }
  if (linking && this_01 != (cmGeneratorTarget *)0x0) {
    TVar2 = cmGeneratorTarget::GetType(this_01);
    if (TVar2 == EXECUTABLE) {
      bVar1 = cmGeneratorTarget::IsExecutableWithExports(this_01);
      if (!bVar1) {
        this_01 = (cmGeneratorTarget *)0x0;
      }
    }
  }
  if (this_01 != (cmGeneratorTarget *)0x0) {
    AddTargetDepend(this,local_1b8,this_01,&dependee_name->Backtrace,linking,cross);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(size_t depender_index,
                                             cmLinkItem const& dependee_name,
                                             bool linking, bool cross)
{
  // Get the depender.
  cmGeneratorTarget const* depender = this->Targets[depender_index];

  // Check the target's makefile first.
  cmGeneratorTarget const* dependee = dependee_name.Target;

  if (!dependee && !linking &&
      (depender->GetType() != cmStateEnums::GLOBAL_TARGET)) {
    MessageType messageType = MessageType::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (depender->GetPolicyStatusCMP0046()) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0046) << "\n";
        issueMessage = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
        break;
    }
    if (issueMessage) {
      cmake* cm = this->GlobalGenerator->GetCMakeInstance();

      e << "The dependency target \"" << dependee_name << "\" of target \""
        << depender->GetName() << "\" does not exist.";

      cm->IssueMessage(messageType, e.str(), dependee_name.Backtrace);
    }
  }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (linking && dependee && dependee->GetType() == cmStateEnums::EXECUTABLE &&
      !dependee->IsExecutableWithExports()) {
    dependee = nullptr;
  }

  if (dependee) {
    this->AddTargetDepend(depender_index, dependee, dependee_name.Backtrace,
                          linking, cross);
  }
}